

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::setVerticalScrollMode(QAbstractItemView *this,ScrollMode mode)

{
  QAbstractItemViewPrivate *this_00;
  ScrollMode in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  QModelIndex topLeft;
  undefined1 local_28 [8];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QAbstractItemView *)0x802ccd);
  this_00->verticalScrollModeSet = true;
  if (in_ESI != this_00->verticalScrollMode) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QPoint::QPoint((QPoint *)this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    (**(code **)(*in_RDI + 0x1f0))(&local_20,in_RDI,local_28);
    this_00->verticalScrollMode = in_ESI;
    if (in_ESI == ScrollPerItem) {
      QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this_00);
      QScrollBar::d_func((QScrollBar *)0x802d64);
      QAbstractSliderPrivate::itemviewChangeSingleStep
                ((QAbstractSliderPrivate *)this_00,(int)((ulong)in_RDI >> 0x20));
    }
    else {
      QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this_00);
      QAbstractSlider::setSingleStep((QAbstractSlider *)this_00,(int)((ulong)in_RDI >> 0x20));
    }
    (**(code **)(*in_RDI + 0x268))();
    (**(code **)(*in_RDI + 0x1e8))(in_RDI,&local_20,1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::setVerticalScrollMode(ScrollMode mode)
{
    Q_D(QAbstractItemView);
    d->verticalScrollModeSet = true;
    if (mode == d->verticalScrollMode)
        return;
    QModelIndex topLeft = indexAt(QPoint(0, 0));
    d->verticalScrollMode = mode;
    if (mode == ScrollPerItem)
        verticalScrollBar()->d_func()->itemviewChangeSingleStep(1); // setSingleStep(-1) => step with 1
    else
        verticalScrollBar()->setSingleStep(-1); // Ensure that the view can update single step
    updateGeometries(); // update the scroll bars
    scrollTo(topLeft, QAbstractItemView::PositionAtTop);
}